

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

int pg::mark_solved_rec_CALL(WorkerP *w,Task *__dq_head,PSISolver *arg_1,int arg_2,int arg_3)

{
  Worker *pWVar1;
  uint arg_3_00;
  int iVar2;
  int iVar3;
  long lVar4;
  TD_mark_solved_rec *t;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (arg_3 < 0x40) {
    iVar2 = 0;
    lVar6 = done + (long)arg_2 * 4;
    lVar4 = (long)arg_2 * 4 + won;
    for (uVar7 = 0; (uint)(~(arg_3 >> 0x1f) & arg_3) != uVar7; uVar7 = uVar7 + 1) {
      if (*(int *)(lVar6 + uVar7 * 4) == 2) {
        iVar2 = iVar2 + 1;
        *(undefined4 *)(lVar4 + uVar7 * 4) = 1;
        *(undefined4 *)(lVar6 + uVar7 * 4) = 3;
      }
    }
  }
  else {
    if (w->end == __dq_head) {
      lace_abort_stack_overflow();
    }
    arg_3_00 = (uint)arg_3 >> 1;
    __dq_head->f = mark_solved_rec_WRAP;
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
    *(PSISolver **)__dq_head->d = arg_1;
    *(uint *)(__dq_head->d + 8) = arg_3_00 + arg_2;
    *(uint *)(__dq_head->d + 0xc) = arg_3 - arg_3_00;
    pWVar1 = w->_public;
    if (w->allstolen == '\0') {
      if (pWVar1->movesplit != '\0') {
        uVar5 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                      (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
        LOCK();
        *(uint *)((long)&pWVar1->ts + 4) = uVar5;
        UNLOCK();
        w->split = w->dq + uVar5;
        pWVar1->movesplit = '\0';
      }
    }
    else {
      if (pWVar1->movesplit != '\0') {
        pWVar1->movesplit = '\0';
      }
      uVar7 = (long)__dq_head - (long)w->dq;
      LOCK();
      pWVar1->ts = (TailSplit)
                   ((uVar7 >> 6 & 0xffffffff | (uVar7 & 0xffffffffffffffc0) << 0x1a) + 0x100000000);
      UNLOCK();
      pWVar1->allstolen = '\0';
      w->split = __dq_head + 1;
      w->allstolen = '\0';
    }
    iVar3 = mark_solved_rec_CALL(w,__dq_head + 1,arg_1,arg_2,arg_3_00);
    if ((w->_public->movesplit == '\0') && (w->split <= __dq_head)) {
      (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
      iVar2 = mark_solved_rec_CALL
                        (w,__dq_head,*(PSISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
                         *(int *)(__dq_head->d + 0xc));
    }
    else {
      iVar2 = mark_solved_rec_SYNC_SLOW(w,__dq_head);
    }
    iVar2 = iVar2 + iVar3;
  }
  return iVar2;
}

Assistant:

TASK_3(int, mark_solved_rec, PSISolver*, s, int, begin, int, count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] == 2) { // done[n] == 3 proxies disabled and won
                won[n] = 1;
                done[n] = 3; // mark as won
                res++;
            }
        }
        return res;
    } else {
        SPAWN(mark_solved_rec, s, begin+count/2, count-count/2);
        int res = CALL(mark_solved_rec, s, begin, count/2);
        return res + SYNC(mark_solved_rec);
    }
}